

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyValue
          (ParserImpl *this,string *full_type_name,DescriptorPool *pool,string *serialized_value)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Message *pMVar4;
  undefined4 extraout_var;
  MessageLite *pMVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  undefined1 local_e8 [8];
  string sub_delimiter;
  scoped_ptr<google::protobuf::Message> value;
  Message *value_prototype;
  DynamicMessageFactory factory;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Descriptor *local_38;
  Descriptor *value_descriptor;
  string *serialized_value_local;
  DescriptorPool *pool_local;
  string *full_type_name_local;
  ParserImpl *this_local;
  
  value_descriptor = (Descriptor *)serialized_value;
  serialized_value_local = (string *)pool;
  pool_local = (DescriptorPool *)full_type_name;
  full_type_name_local = (string *)this;
  local_38 = DescriptorPool::FindMessageTypeByName(pool,full_type_name);
  if (local_38 == (Descriptor *)0x0) {
    std::operator+(&local_78,"Could not find type \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pool_local);
    std::operator+(&local_58,&local_78,"\" stored in google.protobuf.Any.");
    ReportError(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    this_local._7_1_ = 0;
    goto LAB_005a19a6;
  }
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&value_prototype);
  pMVar4 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&value_prototype,local_38);
  if (pMVar4 == (Message *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    iVar2 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[3])();
    internal::scoped_ptr<google::protobuf::Message>::scoped_ptr
              ((scoped_ptr<google::protobuf::Message> *)((long)&sub_delimiter.field_2 + 8),
               (Message *)CONCAT44(extraout_var,iVar2));
    std::__cxx11::string::string((string *)local_e8);
    bVar1 = ConsumeMessageDelimiter(this,(string *)local_e8);
    if (bVar1) {
      pMVar4 = internal::scoped_ptr<google::protobuf::Message>::get
                         ((scoped_ptr<google::protobuf::Message> *)
                          ((long)&sub_delimiter.field_2 + 8));
      std::__cxx11::string::string((string *)&local_108,(string *)local_e8);
      bVar1 = ConsumeMessage(this,pMVar4,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      if (bVar1) {
        if ((this->allow_partial_ & 1U) == 0) {
          pMVar4 = internal::scoped_ptr<google::protobuf::Message>::operator->
                             ((scoped_ptr<google::protobuf::Message> *)
                              ((long)&sub_delimiter.field_2 + 8));
          uVar3 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[8])();
          if ((uVar3 & 1) == 0) {
            std::operator+(&local_148,"Value of type \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pool_local);
            std::operator+(&local_128,&local_148,
                           "\" stored in google.protobuf.Any has missing required fields");
            ReportError(this,&local_128);
            std::__cxx11::string::~string((string *)&local_128);
            std::__cxx11::string::~string((string *)&local_148);
            this_local._7_1_ = 0;
            goto LAB_005a1956;
          }
          pMVar5 = &internal::scoped_ptr<google::protobuf::Message>::operator->
                              ((scoped_ptr<google::protobuf::Message> *)
                               ((long)&sub_delimiter.field_2 + 8))->super_MessageLite;
          MessageLite::AppendToString(pMVar5,(string *)value_descriptor);
        }
        else {
          pMVar5 = &internal::scoped_ptr<google::protobuf::Message>::operator->
                              ((scoped_ptr<google::protobuf::Message> *)
                               ((long)&sub_delimiter.field_2 + 8))->super_MessageLite;
          MessageLite::AppendPartialToString(pMVar5,(string *)value_descriptor);
        }
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
LAB_005a1956:
    std::__cxx11::string::~string((string *)local_e8);
    internal::scoped_ptr<google::protobuf::Message>::~scoped_ptr
              ((scoped_ptr<google::protobuf::Message> *)((long)&sub_delimiter.field_2 + 8));
  }
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&value_prototype);
LAB_005a19a6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeAnyValue(const string& full_type_name, const DescriptorPool* pool,
                       string* serialized_value) {
    const Descriptor* value_descriptor =
        pool->FindMessageTypeByName(full_type_name);
    if (value_descriptor == NULL) {
      ReportError("Could not find type \"" + full_type_name +
                  "\" stored in google.protobuf.Any.");
      return false;
    }
    DynamicMessageFactory factory;
    const Message* value_prototype = factory.GetPrototype(value_descriptor);
    if (value_prototype == NULL) {
      return false;
    }
    google::protobuf::scoped_ptr<Message> value(value_prototype->New());
    string sub_delimiter;
    DO(ConsumeMessageDelimiter(&sub_delimiter));
    DO(ConsumeMessage(value.get(), sub_delimiter));

    if (allow_partial_) {
      value->AppendPartialToString(serialized_value);
    } else {
      if (!value->IsInitialized()) {
        ReportError(
            "Value of type \"" + full_type_name +
            "\" stored in google.protobuf.Any has missing required fields");
        return false;
      }
      value->AppendToString(serialized_value);
    }
    return true;
  }